

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.c
# Opt level: O2

void nni_plat_mtx_init(nni_plat_mtx *mtx)

{
  int iVar1;
  
  while( true ) {
    iVar1 = pthread_mutex_init((pthread_mutex_t *)mtx,(pthread_mutexattr_t *)&nni_mxattr);
    if (iVar1 == 0) {
      return;
    }
    iVar1 = pthread_mutex_init((pthread_mutex_t *)mtx,(pthread_mutexattr_t *)0x0);
    if (iVar1 == 0) break;
    nni_msleep(10);
  }
  return;
}

Assistant:

void
nni_plat_mtx_init(nni_plat_mtx *mtx)
{
	// On most platforms, pthread_mutex_init cannot ever fail, when
	// given NULL attributes.  Linux and Solaris fall into this category.
	// BSD platforms (including OpenBSD, FreeBSD, and macOS) seem to
	// attempt to allocate memory during mutex initialization.

	// An earlier design worked around failures here by using a global
	// fallback lock, but this was potentially racy, complex, and led
	// to some circumstances where we were simply unable to provide
	// adequate debug.

	// If you find you're spending time in this function, consider
	// adding more memory, reducing consumption, or moving to an
	// operating system that doesn't need to do heap allocations
	// to create mutexes.

	// The symptom will be an apparently stuck application spinning
	// every 10 ms trying to allocate this lock.

	while ((pthread_mutex_init(&mtx->mtx, &nni_mxattr) != 0) &&
	    (pthread_mutex_init(&mtx->mtx, NULL) != 0)) {
		// We must have memory exhaustion -- ENOMEM, or
		// in some cases EAGAIN.  Wait a bit before we try to
		// give things a chance to settle down.
		nni_msleep(10);
	}
}